

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

protobuf_test_messages_proto2_TestAllTypesProto2 *
protobuf_test_messages_proto2_TestAllTypesProto2_parse(char *buf,size_t size,upb_Arena *arena)

{
  upb_DecodeStatus uVar1;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg;
  
  msg = protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);
  if (msg == (protobuf_test_messages_proto2_TestAllTypesProto2 *)0x0) {
    msg = (protobuf_test_messages_proto2_TestAllTypesProto2 *)0x0;
  }
  else {
    uVar1 = upb_Decode(buf,size,&msg->base_dont_copy_me__upb_internal_use_only,
                       &protobuf_0test_0messages__proto2__TestAllTypesProto2_msg_init,
                       (upb_ExtensionRegistry *)0x0,0,arena);
    if (uVar1 != kUpb_DecodeStatus_Ok) {
      msg = (protobuf_test_messages_proto2_TestAllTypesProto2 *)0x0;
    }
  }
  return msg;
}

Assistant:

UPB_INLINE protobuf_test_messages_proto2_TestAllTypesProto2* protobuf_test_messages_proto2_TestAllTypesProto2_parse(const char* buf, size_t size, upb_Arena* arena) {
  protobuf_test_messages_proto2_TestAllTypesProto2* ret = protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);
  if (!ret) return NULL;
  if (upb_Decode(buf, size, UPB_UPCAST(ret), &protobuf_0test_0messages__proto2__TestAllTypesProto2_msg_init, NULL, 0, arena) !=
      kUpb_DecodeStatus_Ok) {
    return NULL;
  }
  return ret;
}